

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O0

MPP_RET h265e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  long lVar1;
  MPP_RET MVar2;
  MppEncH265SliceCfg *slice_cfg;
  MppEncSliceSplit *src_1;
  MppEncCodecCfg *codec;
  MppPacket pkt_out;
  RK_U32 mb_rows;
  MppEncCfgSet *src;
  MppEncCfgImpl *impl;
  MPP_RET ret;
  MppEncCfgSet *cfg;
  H265eCtx *p;
  void *param_local;
  MpiCmd cmd_local;
  void *ctx_local;
  
  lVar1 = *ctx;
  impl._4_4_ = MPP_OK;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","enter ctx %p cmd %08x\n","h265e_proc_cfg",ctx,(ulong)cmd);
  }
  if (cmd == MPP_ENC_SET_CFG) {
    if (*(int *)((long)param + 0x10) != 0) {
      impl._4_4_ = h265e_proc_prep_cfg((MppEncPrepCfg *)(lVar1 + 8),
                                       (MppEncPrepCfg *)((long)param + 0x10));
      *(undefined4 *)((long)param + 0x10) = 0;
    }
    if (*(int *)(lVar1 + 0x164) != 0) {
      if (*(int *)(lVar1 + 0x168) == 0) {
        pkt_out._4_4_ =
             (int)((long)((long)(*(int *)(lVar1 + 0x10) + 0x3f) & 0xffffffffffffffc0U) / 0x40);
      }
      else {
        pkt_out._4_4_ =
             (int)((long)((long)(*(int *)(lVar1 + 0xc) + 0x3f) & 0xffffffffffffffc0U) / 0x40);
      }
      *(uint *)(lVar1 + 0x170) =
           ((pkt_out._4_4_ + *(int *)(lVar1 + 0x16c)) - 1U) / *(uint *)(lVar1 + 0x16c);
      if (*(int *)(lVar1 + 0xc4) < *(int *)(lVar1 + 0x170)) {
        *(undefined4 *)(lVar1 + 0x170) = *(undefined4 *)(lVar1 + 0xc4);
      }
    }
    if (*(int *)((long)param + 0x350) != 0) {
      MVar2 = h265e_proc_h265_cfg((MppEncH265Cfg *)(lVar1 + 0x348),
                                  (MppEncH265Cfg *)((long)param + 0x350));
      impl._4_4_ = MVar2 | impl._4_4_;
      *(undefined4 *)((long)param + 0x350) = 0;
    }
    if (*(int *)((long)param + 0xe98) != 0) {
      MVar2 = h265e_proc_split_cfg
                        ((MppEncSliceSplit *)(lVar1 + 0xe90),
                         (MppEncSliceSplit *)((long)param + 0xe98));
      impl._4_4_ = MVar2 | impl._4_4_;
      *(undefined4 *)((long)param + 0xe98) = 0;
    }
  }
  else if (cmd == MPP_ENC_SET_PREP_CFG) {
    impl._4_4_ = h265e_proc_prep_cfg((MppEncPrepCfg *)(lVar1 + 8),(MppEncPrepCfg *)param);
  }
  else if (cmd == MPP_ENC_SET_CODEC_CFG) {
    impl._4_4_ = h265e_proc_h265_cfg((MppEncH265Cfg *)(lVar1 + 0x348),
                                     (MppEncH265Cfg *)((long)param + 8));
  }
  else if (cmd == MPP_ENC_GET_EXTRA_INFO) {
    h265e_set_extra_info((H265eCtx *)ctx);
    h265e_get_extra_info((H265eCtx *)ctx,param);
  }
  else if (cmd != MPP_ENC_SET_SEI_CFG) {
    if (cmd == MPP_ENC_SET_SPLIT) {
      if (*(int *)((long)param + 4) == 0) {
        *(undefined4 *)(lVar1 + 0x400) = 0;
      }
      else {
        *(undefined4 *)(lVar1 + 0x400) = 1;
        *(undefined4 *)(lVar1 + 0x404) = 0;
        if (*(int *)((long)param + 4) == 2) {
          *(undefined4 *)(lVar1 + 0x404) = 1;
        }
        *(undefined4 *)(lVar1 + 0x408) = *(undefined4 *)((long)param + 8);
      }
    }
    else {
      _mpp_log_l(2,"h265e_api","No correspond %08x found, and can not config!\n",(char *)0x0,
                 (ulong)cmd);
      impl._4_4_ = MPP_NOK;
    }
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","leave ctx %p\n","h265e_proc_cfg",ctx);
  }
  return impl._4_4_;
}

Assistant:

static MPP_RET h265e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    H265eCtx *p = (H265eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;
    MPP_RET ret = MPP_OK;

    h265e_dbg_func("enter ctx %p cmd %08x\n", ctx, cmd);

    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
        MppEncCfgSet *src = &impl->cfg;

        if (src->prep.change) {
            ret |= h265e_proc_prep_cfg(&cfg->prep, &src->prep);
            src->prep.change = 0;
        }

        if (cfg->rc.refresh_en) {
            RK_U32 mb_rows;

            if (MPP_ENC_RC_INTRA_REFRESH_ROW == cfg->rc.refresh_mode)
                mb_rows = MPP_ALIGN(cfg->prep.height, 64) / 64;
            else
                mb_rows = MPP_ALIGN(cfg->prep.width, 64) / 64;

            cfg->rc.refresh_length = (mb_rows + cfg->rc.refresh_num - 1) / cfg->rc.refresh_num;
            if (cfg->rc.gop < cfg->rc.refresh_length)
                cfg->rc.refresh_length = cfg->rc.gop;
        }

        if (src->codec.h265.change) {
            ret |= h265e_proc_h265_cfg(&cfg->codec.h265, &src->codec.h265);
            src->codec.h265.change = 0;
        }
        if (src->split.change) {
            ret |= h265e_proc_split_cfg(&cfg->split, &src->split);
            src->split.change = 0;
        }
    } break;
    case MPP_ENC_GET_EXTRA_INFO: {
        MppPacket pkt_out = (MppPacket )param;
        h265e_set_extra_info(p);
        h265e_get_extra_info(p, pkt_out);
    } break;
    case MPP_ENC_SET_PREP_CFG : {
        ret = h265e_proc_prep_cfg(&cfg->prep, param);
    } break;
    case MPP_ENC_SET_CODEC_CFG: {
        MppEncCodecCfg *codec = (MppEncCodecCfg *)param;
        ret = h265e_proc_h265_cfg(&cfg->codec.h265, &codec->h265);
    } break;

    case MPP_ENC_SET_SEI_CFG: {
    } break;
    case MPP_ENC_SET_SPLIT : {
        MppEncSliceSplit *src = (MppEncSliceSplit *)param;
        MppEncH265SliceCfg *slice_cfg = &cfg->codec.h265.slice_cfg;

        if (src->split_mode > MPP_ENC_SPLIT_NONE) {
            slice_cfg->split_enable = 1;
            slice_cfg->split_mode = 0;
            if (src->split_mode == MPP_ENC_SPLIT_BY_CTU)
                slice_cfg->split_mode = 1;
            slice_cfg->slice_size =  src->split_arg;
        } else {
            slice_cfg->split_enable = 0;
        }
    } break;
    default:
        mpp_err("No correspond %08x found, and can not config!\n", cmd);
        ret = MPP_NOK;
        break;
    }

    h265e_dbg_func("leave ctx %p\n", ctx);
    return ret;
}